

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall
benchmark::internal::BenchmarkImp::RangePair(BenchmarkImp *this,int lo1,int hi1,int lo2,int hi2)

{
  pointer *ppiVar1;
  bool bVar2;
  reference piVar3;
  int local_ac;
  iterator iStack_a8;
  int j;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  iterator iStack_88;
  int i;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> arglist2;
  vector<int,_std::allocator<int>_> arglist1;
  CheckHandler local_28;
  int local_20;
  int local_1c;
  int hi2_local;
  int lo2_local;
  int hi1_local;
  int lo1_local;
  BenchmarkImp *this_local;
  
  bVar2 = false;
  local_20 = hi2;
  local_1c = lo2;
  hi2_local = hi1;
  lo2_local = lo1;
  _hi1_local = this;
  if ((this->arg_count_ == -1) || (this->arg_count_ == 2)) {
    GetNullLogInstance();
  }
  else {
    CheckHandler::CheckHandler
              (&local_28,"arg_count_ == -1 || arg_count_ == 2",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"RangePair",0x1c2);
    bVar2 = true;
    CheckHandler::GetLog(&local_28);
  }
  if (!bVar2) {
    this->arg_count_ = 2;
    ppiVar1 = &arglist2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)ppiVar1);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range2);
    AddRange((vector<int,_std::allocator<int>_> *)ppiVar1,lo2_local,hi2_local,8);
    AddRange((vector<int,_std::allocator<int>_> *)&__range2,local_1c,local_20,8);
    ppiVar1 = &arglist2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)ppiVar1);
    iStack_88 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)ppiVar1);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff78);
      if (!bVar2) break;
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      __range3._4_4_ = *piVar3;
      __end3 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)&__range2);
      iStack_a8 = std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)&__range2);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff58);
        if (!bVar2) break;
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3);
        local_ac = *piVar3;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->args_,
                   (int *)((long)&__range3 + 4),&local_ac);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range2);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &arglist2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return;
  }
  CheckHandler::~CheckHandler(&local_28);
}

Assistant:

void BenchmarkImp::RangePair(int lo1, int hi1, int lo2, int hi2) {
  CHECK(arg_count_ == -1 || arg_count_ == 2);
  arg_count_ = 2;
  std::vector<int> arglist1, arglist2;
  AddRange(&arglist1, lo1, hi1, kRangeMultiplier);
  AddRange(&arglist2, lo2, hi2, kRangeMultiplier);

  for (int i : arglist1) {
    for (int j : arglist2) {
      args_.emplace_back(i, j);
    }
  }
}